

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  VectorXd *this_00;
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar6;
  Scalar *pSVar7;
  VectorXd *this_01;
  float fVar8;
  Scalar SVar9;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_130;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  MeasurementPackage local_70;
  MeasurementPackage local_50;
  
  if (meas_package->sensor_type_ == LASER) {
    if (this->use_laser_ != true) {
      return;
    }
  }
  else {
    if (meas_package->sensor_type_ != RADAR) {
      return;
    }
    if (this->use_radar_ == false) {
      return;
    }
  }
  if (this->is_initialized_ != false) {
    lVar3 = meas_package->timestamp_;
    lVar4 = this->time_us_;
    this->time_us_ = lVar3;
    Prediction(this,(double)(float)((double)(lVar3 - lVar4) / 1000000.0));
    if (meas_package->sensor_type_ == RADAR) {
      MeasurementPackage::MeasurementPackage(&local_70,meas_package);
      UpdateRadar(this,&local_70);
      local_50.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data =
           local_70.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_storage.m_data;
    }
    else {
      if (meas_package->sensor_type_ != LASER) {
        return;
      }
      MeasurementPackage::MeasurementPackage(&local_50,meas_package);
      UpdateLidar(this,&local_50);
    }
    free(local_50.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    return;
  }
  this_00 = &this->x_;
  local_130.m_row = 0;
  local_130.m_col = 1;
  local_130.m_currentBlockRows = 1;
  *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 1.0;
  local_138 = 1.0;
  local_130.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)this_00;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_130,
                      &local_138);
  local_140 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,&local_140);
  local_148 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,&local_148);
  local_150 = 0.1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&local_150);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_130);
  local_130.m_xpr = &this->P_;
  local_130.m_row = 0;
  local_130.m_col = 1;
  local_130.m_currentBlockRows = 1;
  *(this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       0.15;
  local_138 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_130,&local_138);
  local_140 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_140);
  local_148 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_148);
  local_150 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_150);
  local_78 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_78);
  local_80 = 0.15;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_80);
  local_88 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_88);
  local_90 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_90);
  local_98 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_98);
  local_a0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_a0);
  local_a8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_a8);
  local_b0 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_b0);
  local_b8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_b8);
  local_c0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_c0);
  local_c8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_c8);
  local_d0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_d0);
  local_d8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_d8);
  local_e0 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_e0);
  local_e8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_e8);
  local_f0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_f0);
  local_f8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_f8);
  local_100 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_100);
  local_108 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_108);
  local_110 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&local_110);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_130);
  this->time_us_ = meas_package->timestamp_;
  if (meas_package->sensor_type_ == RADAR) {
    if (this->use_radar_ != true) goto LAB_00102b82;
    this_01 = &meas_package->raw_measurements_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,0);
    dVar1 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,1);
    dVar2 = *pSVar7;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,2);
    fVar8 = cosf((float)dVar2);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    *pSVar7 = (double)(fVar8 * (float)dVar1);
    fVar8 = sinf((float)dVar2);
    SVar9 = (Scalar)(fVar8 * (float)dVar1);
  }
  else {
    if ((meas_package->sensor_type_ != LASER) || (this->use_laser_ != true)) goto LAB_00102b82;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &meas_package->raw_measurements_,0);
    SVar9 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    *pSVar7 = SVar9;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &meas_package->raw_measurements_,1);
    SVar9 = *pSVar7;
  }
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,1);
  *pSVar7 = SVar9;
LAB_00102b82:
  this->is_initialized_ = true;
  return;
}

Assistant:

void UKF::ProcessMeasurement(MeasurementPackage meas_package) {
  /**
  TODO:
  Complete this function! Make sure you switch between lidar and radar
  measurements.
  */
  
  // skip predict/update if sensor type is ignored
  if ((meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_) ||
      (meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_)) {
    
    /*****************************************************************************
    *  Initialization
    ****************************************************************************/
    if (!is_initialized_) {
      /**
      TODO:
      * Initialize the state x_ with the first measurement.
      * Create the covariance matrix.
      * Remember: you'll need to convert radar from polar to cartesian coordinates.
      */
      /**
      Initialize state.
      */

      // first measurement
      x_ << 1, 1, 1, 1, 0.1;

      // init covariance matrix
      P_ << 0.15,    0, 0, 0, 0,
               0, 0.15, 0, 0, 0,
               0,    0, 1, 0, 0,
               0,    0, 0, 1, 0,
               0,    0, 0, 0, 1;

      // init timestamp
      time_us_ = meas_package.timestamp_;

      if (meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_) {

        x_(0) = meas_package.raw_measurements_(0);
        x_(1) = meas_package.raw_measurements_(1);

      }
      else if (meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_) {
        /**
        Convert radar from polar to cartesian coordinates and initialize state.
        */
        float ro = meas_package.raw_measurements_(0);
        float phi = meas_package.raw_measurements_(1);
        float ro_dot = meas_package.raw_measurements_(2);
        x_(0) = ro     * cos(phi);
        x_(1) = ro     * sin(phi);
      }

      // done initializing, no need to predict or update
      is_initialized_ = true;

      return;
    }

    /*****************************************************************************
    *  Prediction
    ****************************************************************************/
    //compute the time elapsed between the current and previous measurements
    float dt = (meas_package.timestamp_ - time_us_) / 1000000.0;	//dt - expressed in seconds
    time_us_ = meas_package.timestamp_;

    Prediction(dt);

    /*****************************************************************************
    *  Update
    ****************************************************************************/

    if (meas_package.sensor_type_ == MeasurementPackage::LASER) {
      UpdateLidar(meas_package);
    }
    else if (meas_package.sensor_type_ == MeasurementPackage::RADAR) {
      UpdateRadar(meas_package);
    }
  }
}